

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O0

TagState * __thiscall
despot::MemoryPool<despot::TagState>::Allocate(MemoryPool<despot::TagState> *this)

{
  value_type pTVar1;
  bool bVar2;
  reference ppTVar3;
  TagState *obj;
  MemoryPool<despot::TagState> *this_local;
  
  bVar2 = std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::empty
                    (&this->freelist_);
  if (bVar2) {
    NewChunk(this);
  }
  ppTVar3 = std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::back
                      (&this->freelist_);
  pTVar1 = *ppTVar3;
  std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::pop_back(&this->freelist_);
  bVar2 = MemoryObject::IsAllocated((MemoryObject *)&pTVar1->field_0x8);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    MemoryObject::SetAllocated((MemoryObject *)&pTVar1->field_0x8);
    this->num_allocated_ = this->num_allocated_ + 1;
    return pTVar1;
  }
  __assert_fail("!obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x34,"T *despot::MemoryPool<despot::TagState>::Allocate() [T = despot::TagState]");
}

Assistant:

T* Allocate() {
		if (freelist_.empty())
			NewChunk();
		T* obj = freelist_.back();
		freelist_.pop_back();
		assert(!obj->IsAllocated());
		obj->SetAllocated();
		num_allocated_++;
		return obj;
	}